

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall
djb::microfacet::args::args(args *this,float_t ax,float_t ay,float_t cor,float_t txn,float_t tyn)

{
  float fVar1;
  double dVar2;
  mat3 local_80;
  mat3 local_5c;
  float local_38;
  float local_34;
  float_t mtra23;
  float_t mtra22;
  float_t mtra21;
  float_t tmp;
  float_t ccor;
  float_t tyn_local;
  float_t txn_local;
  float_t cor_local;
  float_t ay_local;
  float_t ax_local;
  args *this_local;
  
  tmp = tyn;
  ccor = txn;
  tyn_local = cor;
  txn_local = ay;
  cor_local = ax;
  _ay_local = this;
  mat3::mat3(&this->mtra,1.0);
  mat3::mat3(&this->minv,1.0);
  fVar1 = sqr<float>(&tyn_local);
  dVar2 = std::sqrt((double)(ulong)(uint)(1.0 - fVar1));
  mtra21 = SUB84(dVar2,0);
  mtra22 = txn_local * mtra21;
  mtra23 = -tyn_local / (cor_local * mtra21);
  local_34 = 1.0 / mtra22;
  local_38 = (cor_local * tmp + -(txn_local * ccor * tyn_local)) / (cor_local * mtra22);
  mat3::mat3(&local_5c,cor_local,txn_local * tyn_local,0.0,0.0,mtra22,0.0,-ccor,-tmp,1.0);
  memcpy(&this->minv,&local_5c,0x24);
  mat3::mat3(&local_80,1.0 / cor_local,0.0,ccor / cor_local,mtra23,local_34,local_38,0.0,0.0,1.0);
  memcpy(this,&local_80,0x24);
  this->detm = 1.0 / (cor_local * mtra22);
  return;
}

Assistant:

microfacet::args::args(
	float_t ax, float_t ay, float_t cor, float_t txn, float_t tyn
) {
	float_t ccor = sqrt(1 - sqr(cor));
	float_t tmp = ay * ccor;
	float_t mtra21 = - cor / (ax * ccor);
	float_t mtra22 = 1 / tmp;
	float_t mtra23 = (ax * tyn - ay * txn * cor) / (ax * tmp);

	minv = mat3(
		ax   , ay * cor, 0,
		0    , tmp     , 0,
		-txn, -tyn     , 1
	);
	mtra = mat3(
		1 / ax, 0     , txn / ax,
		mtra21, mtra22, mtra23,
		0     , 0     ,   1
	);
	detm = 1 / (ax * tmp);
}